

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::BasicCopyTexSubImage2DCase::createTexture(BasicCopyTexSubImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  undefined4 extraout_var;
  Context *pCVar10;
  NotSupportedError *this_01;
  uint uVar11;
  int iVar12;
  bool bVar13;
  int ndx;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ChannelOrder CVar18;
  float fVar19;
  int local_264;
  deUint32 tex;
  deUint32 local_23c;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat fmt;
  Random rnd;
  PixelBufferAccess local_1f8;
  float local_1c8 [6];
  TextureLevel data;
  GradientShader shader;
  
  iVar4 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar14 = CONCAT44(extraout_var,iVar4);
  bVar13 = false;
  if ((0 < *(int *)(lVar14 + 8)) && (0 < *(int *)(lVar14 + 0xc))) {
    bVar13 = 0 < *(int *)(lVar14 + 0x10);
  }
  iVar4 = *(int *)(lVar14 + 0x14);
  fmt = (this->super_TextureSpecCase).m_texFormat;
  CVar18 = fmt.order;
  bVar3 = (byte)fmt.order;
  local_264 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar17 = (this->super_TextureSpecCase).m_width;
    uVar5 = 0x20;
    uVar11 = 0x20;
    if (uVar17 != 0) {
      uVar11 = 0x1f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar11 = uVar11 ^ 0x1f;
    }
    uVar17 = (this->super_TextureSpecCase).m_height;
    if (uVar17 != 0) {
      uVar5 = 0x1f;
      if (uVar17 != 0) {
        for (; uVar17 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    local_264 = 0x1f - uVar5;
    if ((int)(0x1f - uVar5) < (int)(0x1f - uVar11)) {
      local_264 = 0x1f - uVar11;
    }
    local_264 = local_264 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar6 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6);
  GradientShader::GradientShader(&shader);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  pCVar10 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_23c = (*pCVar10->_vptr_Context[0x75])(pCVar10,&shader);
  if ((CVar18 == A || bVar13) &&
     ((RGBA < CVar18 || (0xedU >> (bVar3 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    if (local_264 != 0) {
      iVar4 = 0;
      do {
        iVar12 = (this->super_TextureSpecCase).m_width >> ((byte)iVar4 & 0x1f);
        iVar15 = (this->super_TextureSpecCase).m_height >> ((byte)iVar4 & 0x1f);
        local_1f8.super_ConstPixelBufferAccess.m_format.order = R;
        local_1f8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_1f8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_1f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        if (iVar12 < 2) {
          iVar12 = 1;
        }
        colorB.m_data[0] = 1.0;
        colorB.m_data[1] = 1.0;
        colorB.m_data[2] = 1.0;
        colorB.m_data[3] = 1.0;
        if (iVar15 < 2) {
          iVar15 = 1;
        }
        colorA.m_data[0] = 0.0;
        colorA.m_data[1] = 0.0;
        colorA.m_data[2] = 0.0;
        colorA.m_data[3] = 0.0;
        lVar14 = 0;
        do {
          fVar1 = (float)local_1f8.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2];
          fVar2 = colorB.m_data[lVar14];
          fVar19 = deRandom_getFloat(&rnd.m_rnd);
          colorA.m_data[lVar14] = (fVar2 - fVar1) * fVar19 + fVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        local_1f8.super_ConstPixelBufferAccess.m_format.order = R;
        local_1f8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_1f8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_1f8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        local_1c8[0] = 1.0;
        local_1c8[1] = 1.0;
        local_1c8[2] = 1.0;
        local_1c8[3] = 1.0;
        colorB.m_data[0] = 0.0;
        colorB.m_data[1] = 0.0;
        colorB.m_data[2] = 0.0;
        colorB.m_data[3] = 0.0;
        lVar14 = 0;
        do {
          fVar1 = (float)local_1f8.super_ConstPixelBufferAccess.m_size.m_data[lVar14 + -2];
          fVar2 = local_1c8[lVar14];
          fVar19 = deRandom_getFloat(&rnd.m_rnd);
          colorB.m_data[lVar14] = (fVar2 - fVar1) * fVar19 + fVar1;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        tcu::TextureLevel::setSize(&data,iVar12,iVar15,1);
        tcu::TextureLevel::getAccess(&local_1f8,&data);
        tcu::fillWithGrid(&local_1f8,dVar6 % 0xf + 2,&colorA,&colorB);
        dVar6 = this->m_format;
        dVar7 = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_1f8,&data);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,0xde1,iVar4,dVar6,iVar12,iVar15,0,dVar6,dVar7,
                   local_1f8.super_ConstPixelBufferAccess.m_data);
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_264);
    }
    pCVar10 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1f8.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_1f8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_1f8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
         local_1f8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ & 0xffffffff00000000;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data._8_8_ = colorA.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar10,local_23c,(Vec3 *)&local_1f8,(Vec3 *)&colorA);
    if (local_264 != 0) {
      iVar4 = 0;
      do {
        uVar17 = (this->super_TextureSpecCase).m_width >> ((byte)iVar4 & 0x1f);
        if ((int)uVar17 < 2) {
          uVar17 = 1;
        }
        uVar11 = (this->super_TextureSpecCase).m_height >> ((byte)iVar4 & 0x1f);
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        uVar5 = dVar6 % uVar17;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        uVar16 = dVar6 % uVar11;
        dVar6 = deRandom_getUint32(&rnd.m_rnd);
        dVar7 = deRandom_getUint32(&rnd.m_rnd);
        iVar12 = sglr::ContextWrapper::getWidth(this_00);
        dVar8 = deRandom_getUint32(&rnd.m_rnd);
        iVar15 = sglr::ContextWrapper::getHeight(this_00);
        dVar9 = deRandom_getUint32(&rnd.m_rnd);
        sglr::ContextWrapper::glCopyTexSubImage2D
                  (this_00,0xde1,iVar4,dVar6 % (uVar17 - uVar5),dVar7 % (uVar11 - uVar16),
                   dVar8 % (iVar12 - uVar5),dVar9 % (iVar15 - uVar16),uVar5 + 1,uVar16 + 1);
        iVar4 = iVar4 + 1;
      } while (local_264 != iVar4);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x573);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(levelW, levelH);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		xo			= rnd.getInt(0, levelW-w);
			int		yo			= rnd.getInt(0, levelH-h);

			int		x			= rnd.getInt(0, getWidth() - w);
			int		y			= rnd.getInt(0, getHeight() - h);

			glCopyTexSubImage2D(GL_TEXTURE_2D, ndx, xo, yo, x, y, w, h);
		}
	}